

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O0

int Rwt_ManNodeVolume(Rwt_Man_t *p,Rwt_Node_t *p0,Rwt_Node_t *p1)

{
  int local_24;
  Rwt_Node_t *pRStack_20;
  int Volume;
  Rwt_Node_t *p1_local;
  Rwt_Node_t *p0_local;
  Rwt_Man_t *p_local;
  
  local_24 = 0;
  pRStack_20 = p1;
  p1_local = p0;
  p0_local = (Rwt_Node_t *)p;
  Rwt_ManIncTravId(p);
  Rwt_Trav_rec((Rwt_Man_t *)p0_local,p1_local,&local_24);
  Rwt_Trav_rec((Rwt_Man_t *)p0_local,pRStack_20,&local_24);
  return local_24;
}

Assistant:

int Rwt_ManNodeVolume( Rwt_Man_t * p, Rwt_Node_t * p0, Rwt_Node_t * p1 )
{
    int Volume = 0;
    Rwt_ManIncTravId( p );
    Rwt_Trav_rec( p, p0, &Volume );
    Rwt_Trav_rec( p, p1, &Volume );
    return Volume;
}